

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeExports(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *pBVar1;
  Module *this_00;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  pointer pEVar5;
  Name *pNVar6;
  U32LEB local_ac;
  size_t local_a8;
  char *local_a0;
  U32LEB local_94;
  size_t local_90;
  char *local_88;
  U32LEB local_7c;
  size_t local_78;
  char *local_70;
  U32LEB local_64;
  size_t local_60;
  char *local_58;
  U32LEB local_50;
  U32LEB local_4c;
  size_t local_48;
  char *pcStack_40;
  reference local_38;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  WasmBinaryWriter *pWStack_10;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  pWStack_10 = this;
  sVar4 = std::
          vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ::size(&this->wasm->exports);
  if (sVar4 != 0) {
    __range1._4_4_ = startSection<wasm::BinaryConsts::Section>(this,Export);
    pBVar1 = this->o;
    sVar4 = std::
            vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ::size(&this->wasm->exports);
    LEB<unsigned_int,_unsigned_char>::LEB((LEB<unsigned_int,_unsigned_char> *)&__range1,(uint)sVar4)
    ;
    BufferWithRandomAccess::operator<<(pBVar1,__range1._0_4_);
    this_00 = this->wasm;
    __end1 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin(&this_00->exports);
    curr = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
           std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::end(&this_00->exports);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                       *)&curr), bVar2) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                 ::operator*(&__end1);
      pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_38);
      local_48 = (pEVar5->name).super_IString.str._M_len;
      pcStack_40 = (pEVar5->name).super_IString.str._M_str;
      writeInlineString(this,(pEVar5->name).super_IString.str);
      pBVar1 = this->o;
      pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_38);
      LEB<unsigned_int,_unsigned_char>::LEB(&local_4c,pEVar5->kind);
      BufferWithRandomAccess::operator<<(pBVar1,local_4c);
      pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_38);
      switch(pEVar5->kind) {
      case Function:
        pBVar1 = this->o;
        pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (local_38);
        pNVar6 = Export::getInternalName(pEVar5);
        local_60 = (pNVar6->super_IString).str._M_len;
        local_58 = (pNVar6->super_IString).str._M_str;
        uVar3 = getFunctionIndex(this,(Name)(pNVar6->super_IString).str);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_50,uVar3);
        BufferWithRandomAccess::operator<<(pBVar1,local_50);
        break;
      case Table:
        pBVar1 = this->o;
        pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (local_38);
        pNVar6 = Export::getInternalName(pEVar5);
        local_78 = (pNVar6->super_IString).str._M_len;
        local_70 = (pNVar6->super_IString).str._M_str;
        uVar3 = getTableIndex(this,(Name)(pNVar6->super_IString).str);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_64,uVar3);
        BufferWithRandomAccess::operator<<(pBVar1,local_64);
        break;
      case Memory:
        pBVar1 = this->o;
        pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (local_38);
        pNVar6 = Export::getInternalName(pEVar5);
        local_90 = (pNVar6->super_IString).str._M_len;
        local_88 = (pNVar6->super_IString).str._M_str;
        uVar3 = getMemoryIndex(this,(Name)(pNVar6->super_IString).str);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_7c,uVar3);
        BufferWithRandomAccess::operator<<(pBVar1,local_7c);
        break;
      case Global:
        pBVar1 = this->o;
        pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (local_38);
        pNVar6 = Export::getInternalName(pEVar5);
        local_a8 = (pNVar6->super_IString).str._M_len;
        local_a0 = (pNVar6->super_IString).str._M_str;
        uVar3 = getGlobalIndex(this,(Name)(pNVar6->super_IString).str);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_94,uVar3);
        BufferWithRandomAccess::operator<<(pBVar1,local_94);
        break;
      case Tag:
        pBVar1 = this->o;
        pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (local_38);
        pNVar6 = Export::getInternalName(pEVar5);
        uVar3 = getTagIndex(this,(Name)(pNVar6->super_IString).str);
        LEB<unsigned_int,_unsigned_char>::LEB(&local_ac,uVar3);
        BufferWithRandomAccess::operator<<(pBVar1,local_ac);
        break;
      default:
        handle_unreachable("unexpected extern kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                           ,0x275);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
      ::operator++(&__end1);
    }
    finishSection(this,__range1._4_4_);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeExports() {
  if (wasm->exports.size() == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Export);
  o << U32LEB(wasm->exports.size());
  for (auto& curr : wasm->exports) {
    writeInlineString(curr->name.str);
    o << U32LEB(int32_t(curr->kind));
    switch (curr->kind) {
      case ExternalKind::Function:
        o << U32LEB(getFunctionIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Table:
        o << U32LEB(getTableIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Memory:
        o << U32LEB(getMemoryIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Global:
        o << U32LEB(getGlobalIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Tag:
        o << U32LEB(getTagIndex(*curr->getInternalName()));
        break;
      default:
        WASM_UNREACHABLE("unexpected extern kind");
    }
  }
  finishSection(start);
}